

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.cpp
# Opt level: O2

void cmd_util::dumpEntryInfo(ExeElementWrapper *w)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar6;
  long lVar7;
  char cVar8;
  WrappedValue value;
  QString translated;
  QString str;
  
  if (w != (ExeElementWrapper *)0x0) {
    std::operator<<((ostream *)&std::cout,"\n------\n");
    iVar2 = (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xf])(w);
    poVar5 = std::operator<<((ostream *)&std::cout,"[");
    (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(&translated,w);
    QString::toStdString_abi_cxx11_((string *)&value,&translated);
    poVar5 = std::operator<<(poVar5,(string *)&value);
    poVar5 = std::operator<<(poVar5,"] ");
    poVar5 = std::operator<<(poVar5,"size: 0x");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xd])(w);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,"fieldsCount: ");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,"\n");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&value);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&translated);
    for (lVar7 = 0; lVar7 != CONCAT44(extraout_var,iVar2); lVar7 = lVar7 + 1) {
      iVar3 = (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x14])
                        (w,lVar7,0xffffffffffffffff);
      if (CONCAT44(extraout_var_00,iVar3) != -1) {
        lVar6 = *(long *)(std::cout + -0x18);
        std::ios::fill();
        QIODevice::errorString[lVar6] = (code)0x30;
        poVar5 = std::operator<<((ostream *)&std::cout,"[");
        lVar6 = *(long *)poVar5;
        lVar1 = *(long *)(lVar6 + -0x18);
        *(uint *)(poVar5 + lVar1 + 0x18) = *(uint *)(poVar5 + lVar1 + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(poVar5 + *(long *)(lVar6 + -0x18) + 0x10) = 8;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::operator<<(poVar5,"]");
        poVar5 = std::operator<<((ostream *)&std::cout," ");
        (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x17])
                  ((string *)&translated,w,lVar7);
        QString::toStdString_abi_cxx11_((string *)&value,&translated);
        poVar5 = std::operator<<(poVar5,(string *)&value);
        std::operator<<(poVar5,"\t");
        std::__cxx11::string::~string((string *)&value);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&translated);
        iVar3 = (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x10])(w);
        for (lVar6 = 0;
            CONCAT44(extraout_var_01,iVar3) + (ulong)(CONCAT44(extraout_var_01,iVar3) == 0) != lVar6
            ; lVar6 = lVar6 + 1) {
          (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x18])(&value,w,lVar7,lVar6);
          if (value.m_Size == 0) break;
          WrappedValue::toQString(&str,&value);
          uVar4 = (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x1a])(w,lVar7,lVar6);
          cVar8 = (char)(0x5676725f >> ((char)uVar4 * '\b' & 0x1fU));
          if (3 < uVar4) {
            cVar8 = '_';
          }
          poVar5 = std::operator<<((ostream *)&std::cout,"[");
          QString::toStdString_abi_cxx11_((string *)&translated,&str);
          poVar5 = std::operator<<(poVar5,(string *)&translated);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,cVar8);
          std::operator<<(poVar5,"]");
          std::__cxx11::string::~string((string *)&translated);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&str.d);
        }
        (*(w->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x15])
                  ((string *)&translated,w,lVar7);
        if (0 < translated.d.size) {
          poVar5 = std::operator<<((ostream *)&std::cout," ");
          QString::toStdString_abi_cxx11_((string *)&value,&translated);
          poVar5 = std::operator<<(poVar5,(string *)&value);
          std::operator<<(poVar5," ");
          std::__cxx11::string::~string((string *)&value);
        }
        std::operator<<((ostream *)&std::cout,"\n");
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&translated);
      }
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"------");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  return;
}

Assistant:

void cmd_util::dumpEntryInfo(ExeElementWrapper *w)
{
    if (w == NULL) return;
    
    std::cout << "\n------\n";
    size_t fields = w->getFieldsCount();
    
    std::cout << "[" << w->getName().toStdString() << "] "
        << "size: 0x" << std::hex << w->getSize()
        << " " 
        << "fieldsCount: " << std::dec << fields << "\n" 
        << std::endl;

    for (size_t i = 0; i < fields; i++) {
        offset_t offset = w->getFieldOffset(i);
        if (offset == INVALID_ADDR) {
            continue;
        }
        OUT_PADDED_OFFSET(std::cout, offset);
        std::cout << " " << w->getFieldName(i).toStdString() << "\t";

        size_t subfields = w->getSubFieldsCount();
        if (subfields == 0) subfields = 1; //it may not have a sublist, but a single value
        
        for (size_t y = 0; y < subfields; y++) {
            WrappedValue value = w->getWrappedValue(i, y);
            if (!value.isValid()) break;
            
            QString str = value.toQString();

            Executable::addr_type aType = w->containsAddrType(i, y);
            char c = addrTypeToChar(aType);
            std::cout << "[" << str.toStdString() << " " << c << "]";
        }

        QString translated = w->translateFieldContent(i);
        if (translated.size() > 0) {
            std::cout << " " << translated.toStdString() << " ";
        }
        std::cout << "\n";
    }
    std::cout << "------" << std::endl;
}